

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemViewPrivate::doDelayedItemsLayout(QAbstractItemViewPrivate *this,int delay)

{
  if (this->delayedPendingLayout != false) {
    return;
  }
  this->delayedPendingLayout = true;
  QBasicTimer::start(&this->delayedLayout,(long)delay * 1000000,1,
                     *(undefined8 *)
                      &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  return;
}

Assistant:

void QAbstractItemViewPrivate::doDelayedItemsLayout(int delay)
{
    if (!delayedPendingLayout) {
        delayedPendingLayout = true;
        delayedLayout.start(delay, q_func());
    }
}